

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

bool __thiscall
flatbuffers::python::PythonGenerator::generateStructs
          (PythonGenerator *this,string *one_file_code,ImportMap *one_file_imports)

{
  size_t *code_ptr;
  StructDef *struct_def_00;
  bool bVar1;
  reference ppSVar2;
  ulong uVar3;
  reference ppVar4;
  pair<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar5;
  string local_168;
  undefined1 local_148 [8];
  string mod;
  undefined1 local_118 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  import_str;
  iterator __end4;
  iterator __begin4;
  ImportMap *__range4;
  undefined1 local_90 [8];
  ImportMap imports;
  string declcode;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_30;
  const_iterator it;
  ImportMap *one_file_imports_local;
  string *one_file_code_local;
  PythonGenerator *this_local;
  
  it._M_current = (StructDef **)one_file_imports;
  local_30._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    struct_def = (StructDef *)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end(&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_30);
    struct_def_00 = *ppSVar2;
    code_ptr = &imports._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::__cxx11::string::string((string *)code_ptr);
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_90);
    GenStruct(this,struct_def_00,(string *)code_ptr,
              (set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_90);
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
      GenStructForObjectAPI
                (this,struct_def_00,
                 (string *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      Namer::File<flatbuffers::StructDef>
                ((string *)local_148,&(this->namer_).super_Namer,struct_def_00,SuffixAndExtension);
      Namer::File<flatbuffers::StructDef>
                (&local_168,&(this->namer_).super_Namer,struct_def_00,Suffix);
      bVar1 = SaveType(this,&local_168,(struct_def_00->super_Definition).defined_namespace,
                       (string *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (ImportMap *)local_90,(string *)local_148,true);
      std::__cxx11::string::~string((string *)&local_168);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_148);
      if (!bVar1) goto LAB_002eead8;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &imports._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n\n");
        std::__cxx11::string::operator+=((string *)one_file_code,(string *)&__range4);
        std::__cxx11::string::~string((string *)&__range4);
      }
      __end4 = std::
               set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_90);
      import_str.second.field_2._8_8_ =
           std::
           set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_90);
      while (bVar1 = std::operator!=(&__end4,(_Self *)((long)&import_str.second.field_2 + 8)), bVar1
            ) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end4);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118,ppVar4);
        pVar5 = std::
                set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::insert((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)it._M_current,(value_type *)local_118);
        mod.field_2._8_8_ = pVar5.first._M_node;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_118);
        std::
        _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end4);
      }
LAB_002eead8:
      bVar1 = false;
    }
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_90);
    std::__cxx11::string::~string
              ((string *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar1) goto LAB_002eeb30;
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_30);
  }
  this_local._7_1_ = 1;
LAB_002eeb30:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generateStructs(std::string *one_file_code,
                       ImportMap &one_file_imports) const {
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      std::string declcode;
      ImportMap imports;
      GenStruct(struct_def, &declcode, imports);
      if (parser_.opts.generate_object_based_api) {
        GenStructForObjectAPI(struct_def, &declcode);
      }

      if (parser_.opts.one_file) {
        if (!declcode.empty()) { *one_file_code += declcode + "\n\n"; }

        for (auto import_str : imports) { one_file_imports.insert(import_str); }
      } else {
        const std::string mod =
            namer_.File(struct_def, SkipFile::SuffixAndExtension);
        if (!SaveType(namer_.File(struct_def, SkipFile::Suffix),
                      *struct_def.defined_namespace, declcode, imports, mod,
                      true))
          return false;
      }
    }
    return true;
  }